

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall
QComboBoxPrivateContainer::mousePressEvent(QComboBoxPrivateContainer *this,QMouseEvent *e)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  QComboBox *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QStyleOptionComboBox opt;
  QPoint local_d0;
  QPoint local_c8;
  QStyleOptionComboBox local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x90);
  comboStyleOption(&local_c0,this);
  local_c0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff
  ;
  local_c0.super_QStyleOptionComplex.activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x4;
  pQVar3 = QWidget::style(&this->combo->super_QWidget);
  this_00 = &this->combo->super_QWidget;
  auVar6 = QEventPoint::globalPosition();
  dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_d0.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
  dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_d0.yp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
  local_c8 = QWidget::mapFromGlobal(this_00,&local_d0);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,1,&local_c0,&local_c8,this->combo);
  pQVar4 = this->combo;
  bVar1 = iVar2 != 4;
  if (*(long *)(*(long *)&(pQVar4->super_QWidget).field_0x8 + 0x2a0) == 0) {
    bVar1 = iVar2 == 0;
  }
  if (!bVar1) {
    QWidget::setAttribute((QWidget *)this,WA_NoMouseReplay,true);
    pQVar4 = this->combo;
  }
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x1b0))();
  QIcon::~QIcon(&local_c0.currentIcon);
  if (&(local_c0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_c0.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::mousePressEvent(QMouseEvent *e)
{

    QStyleOptionComboBox opt = comboStyleOption();
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_ComboBoxArrow;
    QStyle::SubControl sc = combo->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt,
                                                           combo->mapFromGlobal(e->globalPosition().toPoint()),
                                                           combo);
    if ((combo->isEditable() && sc == QStyle::SC_ComboBoxArrow)
        || (!combo->isEditable() && sc != QStyle::SC_None))
        setAttribute(Qt::WA_NoMouseReplay);
    combo->hidePopup();
}